

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3dec_f32_to_s16(float *in,drmp3_int16 *out,int num_samples)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  short sVar10;
  float fVar11;
  undefined1 auVar12 [16];
  drmp3_int16 dStack_166;
  drmp3_int16 dStack_164;
  drmp3_int16 dStack_162;
  drmp3_int16 dStack_160;
  drmp3_int16 dStack_15e;
  drmp3_int16 dStack_15c;
  drmp3_int16 dStack_15a;
  int local_130;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  short s;
  float sample;
  __m128i pcm8;
  drmp3_f4 b;
  drmp3_f4 a;
  int aligned_count;
  int i;
  int num_samples_local;
  drmp3_int16 *out_local;
  float *in_local;
  
  if (0 < num_samples) {
    for (local_130 = 0; local_130 < (int)(num_samples & 0xfffffff8U); local_130 = local_130 + 8) {
      uVar1 = *(undefined8 *)(in + local_130);
      uVar2 = *(undefined8 *)(in + local_130 + 2);
      local_e8 = (float)uVar1;
      fStack_e4 = (float)((ulong)uVar1 >> 0x20);
      fStack_e0 = (float)uVar2;
      fStack_dc = (float)((ulong)uVar2 >> 0x20);
      uVar1 = *(undefined8 *)(in + (long)local_130 + 4);
      uVar2 = *(undefined8 *)(in + (long)local_130 + 4 + 2);
      local_108 = (float)uVar1;
      fStack_104 = (float)((ulong)uVar1 >> 0x20);
      fStack_100 = (float)uVar2;
      fStack_fc = (float)((ulong)uVar2 >> 0x20);
      auVar9._4_4_ = fStack_e4 * 32768.0;
      auVar9._0_4_ = local_e8 * 32768.0;
      auVar9._12_4_ = fStack_dc * 32768.0;
      auVar9._8_4_ = fStack_e0 * 32768.0;
      auVar8._8_8_ = 0x46fffe0046fffe00;
      auVar8._0_8_ = 0x46fffe0046fffe00;
      auVar12 = minps(auVar9,auVar8);
      auVar5._8_8_ = 0xc7000000c7000000;
      auVar5._0_8_ = 0xc7000000c7000000;
      auVar12 = maxps(auVar12,auVar5);
      local_98 = auVar12._0_4_;
      fStack_94 = auVar12._4_4_;
      fStack_90 = auVar12._8_4_;
      fStack_8c = auVar12._12_4_;
      auVar7._4_4_ = fStack_104 * 32768.0;
      auVar7._0_4_ = local_108 * 32768.0;
      auVar7._12_4_ = fStack_fc * 32768.0;
      auVar7._8_4_ = fStack_100 * 32768.0;
      auVar6._8_8_ = 0x46fffe0046fffe00;
      auVar6._0_8_ = 0x46fffe0046fffe00;
      auVar12 = minps(auVar7,auVar6);
      auVar4._8_8_ = 0xc7000000c7000000;
      auVar4._0_8_ = 0xc7000000c7000000;
      auVar12 = maxps(auVar12,auVar4);
      local_a8 = auVar12._0_4_;
      fStack_a4 = auVar12._4_4_;
      fStack_a0 = auVar12._8_4_;
      fStack_9c = auVar12._12_4_;
      auVar3._4_4_ = (int)fStack_94;
      auVar3._0_4_ = (int)local_98;
      auVar3._8_4_ = (int)fStack_90;
      auVar3._12_4_ = (int)fStack_8c;
      auVar12._4_4_ = (int)fStack_a4;
      auVar12._0_4_ = (int)local_a8;
      auVar12._8_4_ = (int)fStack_a0;
      auVar12._12_4_ = (int)fStack_9c;
      auVar12 = packssdw(auVar3,auVar12);
      out[local_130] = auVar12._0_2_;
      dStack_166 = auVar12._2_2_;
      out[(long)local_130 + 1] = dStack_166;
      dStack_164 = auVar12._4_2_;
      out[(long)local_130 + 2] = dStack_164;
      dStack_162 = auVar12._6_2_;
      out[(long)local_130 + 3] = dStack_162;
      dStack_160 = auVar12._8_2_;
      out[(long)local_130 + 4] = dStack_160;
      dStack_15e = auVar12._10_2_;
      out[(long)local_130 + 5] = dStack_15e;
      dStack_15c = auVar12._12_2_;
      out[(long)local_130 + 6] = dStack_15c;
      dStack_15a = auVar12._14_2_;
      out[local_130 + 7] = dStack_15a;
    }
    for (; local_130 < num_samples; local_130 = local_130 + 1) {
      fVar11 = in[local_130] * 32768.0;
      if (fVar11 < 32766.5) {
        if (-32767.5 < fVar11) {
          sVar10 = (short)(int)(fVar11 + 0.5);
          out[local_130] = sVar10 - (ushort)(sVar10 < 0);
        }
        else {
          out[local_130] = -0x8000;
        }
      }
      else {
        out[local_130] = 0x7fff;
      }
    }
  }
  return;
}

Assistant:

void drmp3dec_f32_to_s16(const float *in, drmp3_int16 *out, int num_samples)
{
    if(num_samples > 0)
    {
        int i = 0;
#if DRMP3_HAVE_SIMD
        int aligned_count = num_samples & ~7;
        for(; i < aligned_count; i+=8)
        {
            static const drmp3_f4 g_scale = { 32768.0f, 32768.0f, 32768.0f, 32768.0f };
            drmp3_f4 a = DRMP3_VMUL(DRMP3_VLD(&in[i  ]), g_scale);
            drmp3_f4 b = DRMP3_VMUL(DRMP3_VLD(&in[i+4]), g_scale);
#if DRMP3_HAVE_SSE
            static const drmp3_f4 g_max = { 32767.0f, 32767.0f, 32767.0f, 32767.0f };
            static const drmp3_f4 g_min = { -32768.0f, -32768.0f, -32768.0f, -32768.0f };
            __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, g_max), g_min)),
                                           _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, g_max), g_min)));
            out[i  ] = (drmp3_int16)_mm_extract_epi16(pcm8, 0);
            out[i+1] = (drmp3_int16)_mm_extract_epi16(pcm8, 1);
            out[i+2] = (drmp3_int16)_mm_extract_epi16(pcm8, 2);
            out[i+3] = (drmp3_int16)_mm_extract_epi16(pcm8, 3);
            out[i+4] = (drmp3_int16)_mm_extract_epi16(pcm8, 4);
            out[i+5] = (drmp3_int16)_mm_extract_epi16(pcm8, 5);
            out[i+6] = (drmp3_int16)_mm_extract_epi16(pcm8, 6);
            out[i+7] = (drmp3_int16)_mm_extract_epi16(pcm8, 7);
#else
            int16x4_t pcma, pcmb;
            a = DRMP3_VADD(a, DRMP3_VSET(0.5f));
            b = DRMP3_VADD(b, DRMP3_VSET(0.5f));
            pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, DRMP3_VSET(0)))));
            pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, DRMP3_VSET(0)))));
            vst1_lane_s16(out+i  , pcma, 0);
            vst1_lane_s16(out+i+1, pcma, 1);
            vst1_lane_s16(out+i+2, pcma, 2);
            vst1_lane_s16(out+i+3, pcma, 3);
            vst1_lane_s16(out+i+4, pcmb, 0);
            vst1_lane_s16(out+i+5, pcmb, 1);
            vst1_lane_s16(out+i+6, pcmb, 2);
            vst1_lane_s16(out+i+7, pcmb, 3);
#endif
        }
#endif
        for(; i < num_samples; i++)
        {
            float sample = in[i] * 32768.0f;
            if (sample >=  32766.5)
                out[i] = (drmp3_int16) 32767;
            else if (sample <= -32767.5)
                out[i] = (drmp3_int16)-32768;
            else
            {
                short s = (drmp3_int16)(sample + .5f);
                s -= (s < 0);   /* away from zero, to be compliant */
                out[i] = s;
            }
        }
    }
}